

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O3

int ssyrk_(char *uplo,char *trans,integer *n,integer *k,real *alpha,real *a,integer *lda,real *beta,
          real *c__,integer *ldc)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  integer iVar4;
  logical lVar5;
  logical lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint *puVar10;
  ulong uVar11;
  real *prVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  float *pfVar16;
  real *prVar17;
  real *prVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  float *pfVar23;
  size_t __n;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  float fVar27;
  
  uVar8 = (ulong)*lda;
  iVar2 = *ldc;
  uVar9 = (ulong)iVar2;
  lVar5 = lsame_(trans,"N");
  puVar10 = (uint *)n;
  if (lVar5 == 0) {
    puVar10 = (uint *)k;
  }
  uVar20 = *puVar10;
  lVar5 = lsame_(uplo,"U");
  ssyrk_::info = 0;
  if ((lVar5 == 0) && (lVar6 = lsame_(uplo,"L"), lVar6 == 0)) {
    iVar4 = 1;
  }
  else {
    lVar6 = lsame_(trans,"N");
    if ((lVar6 == 0) &&
       ((lVar6 = lsame_(trans,"T"), lVar6 == 0 && (lVar6 = lsame_(trans,"C"), lVar6 == 0)))) {
      iVar4 = 2;
    }
    else {
      uVar3 = *n;
      uVar11 = (ulong)uVar3;
      if ((int)uVar3 < 0) {
        iVar4 = 3;
      }
      else if (*k < 0) {
        iVar4 = 4;
      }
      else {
        if ((int)uVar20 < 2) {
          uVar20 = 1;
        }
        iVar4 = 7;
        if ((int)uVar20 <= *lda) {
          uVar20 = 1;
          if (1 < uVar3) {
            uVar20 = uVar3;
          }
          iVar4 = 10;
          if (((int)uVar20 <= *ldc) && (iVar4 = ssyrk_::info, ssyrk_::info == 0)) {
            if (uVar11 == 0) {
              return 0;
            }
            uVar25 = ~uVar9;
            if ((*alpha == 0.0) && (!NAN(*alpha))) {
              fVar27 = *beta;
              if ((fVar27 == 1.0) && (!NAN(fVar27))) {
                return 0;
              }
              if (lVar5 != 0) {
                if ((fVar27 == 0.0) && (!NAN(fVar27))) {
                  prVar12 = c__ + uVar25 + (long)(iVar2 + 1);
                  __n = 0;
                  do {
                    __n = __n + 4;
                    memset(prVar12,0,__n);
                    prVar12 = prVar12 + uVar9;
                  } while (uVar11 << 2 != __n);
                  return 0;
                }
                prVar12 = c__ + uVar9 + uVar25 + 1;
                lVar15 = 1;
                do {
                  lVar19 = 0;
                  do {
                    prVar12[lVar19] = *beta * prVar12[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar15 != lVar19);
                  lVar15 = lVar15 + 1;
                  prVar12 = prVar12 + uVar9;
                } while (lVar15 != uVar11 + 1);
                return 0;
              }
              if ((fVar27 == 0.0) && (!NAN(fVar27))) {
                uVar20 = 1;
                iVar21 = -1;
                uVar8 = 0;
                iVar24 = iVar2 + 1;
                do {
                  uVar7 = uVar20;
                  if ((int)uVar20 < (int)uVar3) {
                    uVar7 = uVar3;
                  }
                  memset(c__ + uVar25 + (long)iVar24,0,(ulong)(uVar7 + iVar21) * 4 + 4);
                  uVar8 = uVar8 + 1;
                  uVar20 = uVar20 + 1;
                  iVar21 = iVar21 + -1;
                  iVar24 = iVar24 + iVar2 + 1;
                } while (uVar11 != uVar8);
                return 0;
              }
              pfVar23 = c__ + uVar9 + uVar25 + 1;
              lVar15 = 1;
              uVar25 = 0;
              uVar8 = uVar25;
              pfVar16 = pfVar23;
              do {
                do {
                  *pfVar23 = *beta * *pfVar23;
                  pfVar23 = pfVar23 + 1;
                  uVar25 = uVar25 + 1;
                } while (uVar25 < uVar11);
                lVar15 = lVar15 + 1;
                pfVar23 = pfVar16 + uVar9 + 1;
                uVar25 = uVar8 + 1;
                uVar8 = uVar25;
                pfVar16 = pfVar23;
              } while (lVar15 != uVar11 + 1);
              return 0;
            }
            if ((*k == 0) && ((*beta == 1.0 && (!NAN(*beta))))) {
              return 0;
            }
            uVar11 = ~uVar8;
            lVar6 = lsame_(trans,"N");
            uVar20 = *n;
            uVar13 = (ulong)uVar20;
            if (lVar6 != 0) {
              if (lVar5 == 0) {
                if ((int)uVar20 < 1) {
                  return 0;
                }
                iVar24 = *k;
                lVar15 = uVar13 + 1;
                prVar12 = c__ + uVar9 + uVar25;
                prVar17 = a + uVar8 + uVar11;
                lVar19 = 1;
                uVar26 = 0;
                do {
                  fVar27 = *beta;
                  if ((fVar27 != 0.0) || (NAN(fVar27))) {
                    if ((fVar27 != 1.0) || (NAN(fVar27))) {
                      lVar22 = 1;
                      do {
                        prVar12[lVar22] = *beta * prVar12[lVar22];
                        lVar22 = lVar22 + 1;
                      } while (lVar15 != lVar22);
                    }
                  }
                  else {
                    memset(c__ + uVar25 + (long)(int)(((uint)uVar26 + 1) * (iVar2 + 1)),0,
                           (ulong)(~(uint)uVar26 + uVar20) * 4 + 4);
                  }
                  if (0 < iVar24) {
                    uVar14 = 1;
                    prVar18 = prVar17;
                    do {
                      fVar27 = a[uVar11 + lVar19 + uVar14 * uVar8];
                      if ((fVar27 != 0.0) || (NAN(fVar27))) {
                        fVar1 = *alpha;
                        lVar22 = 1;
                        do {
                          prVar12[lVar22] = prVar18[lVar22] * fVar27 * fVar1 + prVar12[lVar22];
                          lVar22 = lVar22 + 1;
                        } while (lVar15 != lVar22);
                      }
                      uVar14 = uVar14 + 1;
                      prVar18 = prVar18 + uVar8;
                    } while (uVar14 != iVar24 + 1);
                  }
                  lVar19 = lVar19 + 1;
                  uVar26 = uVar26 + 1;
                  prVar12 = prVar12 + uVar9 + 1;
                  lVar15 = lVar15 + -1;
                  prVar17 = prVar17 + 1;
                } while (uVar26 != uVar13);
                return 0;
              }
              if ((int)uVar20 < 1) {
                return 0;
              }
              iVar24 = *k;
              prVar12 = c__ + uVar9 + uVar25 + 1;
              lVar15 = 1;
              uVar26 = 0;
              do {
                fVar27 = *beta;
                if ((fVar27 != 0.0) || (NAN(fVar27))) {
                  if ((fVar27 != 1.0) || (NAN(fVar27))) {
                    lVar19 = 0;
                    do {
                      prVar12[lVar19] = *beta * prVar12[lVar19];
                      lVar19 = lVar19 + 1;
                    } while (lVar15 != lVar19);
                  }
                }
                else {
                  memset(c__ + uVar25 + (long)((int)uVar26 * iVar2 + iVar2 + 1),0,uVar26 * 4 + 4);
                }
                if (0 < iVar24) {
                  uVar14 = 1;
                  prVar17 = a + uVar8 + uVar11 + 1;
                  do {
                    fVar27 = a[uVar11 + lVar15 + uVar14 * uVar8];
                    if ((fVar27 != 0.0) || (NAN(fVar27))) {
                      fVar1 = *alpha;
                      lVar19 = 0;
                      do {
                        prVar12[lVar19] = prVar17[lVar19] * fVar27 * fVar1 + prVar12[lVar19];
                        lVar19 = lVar19 + 1;
                      } while (lVar15 != lVar19);
                    }
                    uVar14 = uVar14 + 1;
                    prVar17 = prVar17 + uVar8;
                  } while (uVar14 != iVar24 + 1);
                }
                lVar15 = lVar15 + 1;
                uVar26 = uVar26 + 1;
                prVar12 = prVar12 + uVar9;
              } while (uVar26 != uVar13);
              return 0;
            }
            if (lVar5 == 0) {
              if ((int)uVar20 < 1) {
                return 0;
              }
              iVar2 = *k;
              prVar12 = a + uVar8 + uVar11;
              lVar15 = 1;
              do {
                prVar17 = prVar12;
                lVar19 = lVar15;
                do {
                  fVar27 = 0.0;
                  if (0 < iVar2) {
                    uVar11 = 1;
                    do {
                      fVar27 = fVar27 + prVar17[uVar11] * prVar12[uVar11];
                      uVar11 = uVar11 + 1;
                    } while (iVar2 + 1 != uVar11);
                  }
                  fVar1 = *beta;
                  if ((fVar1 != 0.0) || (NAN(fVar1))) {
                    fVar27 = *alpha * fVar27 + fVar1 * c__[uVar25 + lVar15 * uVar9 + lVar19];
                  }
                  else {
                    fVar27 = *alpha * fVar27;
                  }
                  c__[uVar25 + lVar15 * uVar9 + lVar19] = fVar27;
                  lVar19 = lVar19 + 1;
                  prVar17 = prVar17 + uVar8;
                } while (lVar19 != uVar13 + 1);
                lVar15 = lVar15 + 1;
                prVar12 = prVar12 + uVar8;
              } while (lVar15 != uVar13 + 1);
              return 0;
            }
            if ((int)uVar20 < 1) {
              return 0;
            }
            iVar2 = *k;
            lVar15 = 2;
            lVar19 = 1;
            prVar12 = a + uVar8 + uVar11;
            do {
              lVar22 = 1;
              prVar17 = a + uVar8 + uVar11;
              do {
                fVar27 = 0.0;
                if (0 < iVar2) {
                  uVar26 = 1;
                  do {
                    fVar27 = fVar27 + prVar17[uVar26] * prVar12[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (iVar2 + 1 != uVar26);
                }
                fVar1 = *beta;
                if ((fVar1 != 0.0) || (NAN(fVar1))) {
                  fVar27 = *alpha * fVar27 + fVar1 * c__[uVar25 + lVar19 * uVar9 + lVar22];
                }
                else {
                  fVar27 = *alpha * fVar27;
                }
                c__[uVar25 + lVar19 * uVar9 + lVar22] = fVar27;
                lVar22 = lVar22 + 1;
                prVar17 = prVar17 + uVar8;
              } while (lVar22 != lVar15);
              lVar19 = lVar19 + 1;
              lVar15 = lVar15 + 1;
              prVar12 = prVar12 + uVar8;
            } while (lVar19 != uVar13 + 1);
            return 0;
          }
        }
      }
    }
  }
  ssyrk_::info = iVar4;
  xerbla_("SSYRK ",&ssyrk_::info);
  return 0;
}

Assistant:

int ssyrk_(char *uplo, char *trans, integer *n, integer *k,
	real *alpha, real *a, integer *lda, real *beta, real *c__, integer *
	ldc)
{
    /* System generated locals */
    integer a_dim1, a_offset, c_dim1, c_offset, i__1, i__2, i__3;

    /* Local variables */
    static integer i__, j, l, info;
    static real temp;
    extern logical lsame_(char *, char *);
    static integer nrowa;
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);


/*
    Purpose
    =======

    SSYRK  performs one of the symmetric rank k operations

       C := alpha*A*A' + beta*C,

    or

       C := alpha*A'*A + beta*C,

    where  alpha and beta  are scalars, C is an  n by n  symmetric matrix
    and  A  is an  n by k  matrix in the first case and a  k by n  matrix
    in the second case.

    Parameters
    ==========

    UPLO   - CHARACTER*1.
             On  entry,   UPLO  specifies  whether  the  upper  or  lower
             triangular  part  of the  array  C  is to be  referenced  as
             follows:

                UPLO = 'U' or 'u'   Only the  upper triangular part of  C
                                    is to be referenced.

                UPLO = 'L' or 'l'   Only the  lower triangular part of  C
                                    is to be referenced.

             Unchanged on exit.

    TRANS  - CHARACTER*1.
             On entry,  TRANS  specifies the operation to be performed as
             follows:

                TRANS = 'N' or 'n'   C := alpha*A*A' + beta*C.

                TRANS = 'T' or 't'   C := alpha*A'*A + beta*C.

                TRANS = 'C' or 'c'   C := alpha*A'*A + beta*C.

             Unchanged on exit.

    N      - INTEGER.
             On entry,  N specifies the order of the matrix C.  N must be
             at least zero.
             Unchanged on exit.

    K      - INTEGER.
             On entry with  TRANS = 'N' or 'n',  K  specifies  the number
             of  columns   of  the   matrix   A,   and  on   entry   with
             TRANS = 'T' or 't' or 'C' or 'c',  K  specifies  the  number
             of rows of the matrix  A.  K must be at least zero.
             Unchanged on exit.

    ALPHA  - REAL            .
             On entry, ALPHA specifies the scalar alpha.
             Unchanged on exit.

    A      - REAL             array of DIMENSION ( LDA, ka ), where ka is
             k  when  TRANS = 'N' or 'n',  and is  n  otherwise.
             Before entry with  TRANS = 'N' or 'n',  the  leading  n by k
             part of the array  A  must contain the matrix  A,  otherwise
             the leading  k by n  part of the array  A  must contain  the
             matrix A.
             Unchanged on exit.

    LDA    - INTEGER.
             On entry, LDA specifies the first dimension of A as declared
             in  the  calling  (sub)  program.   When  TRANS = 'N' or 'n'
             then  LDA must be at least  max( 1, n ), otherwise  LDA must
             be at least  max( 1, k ).
             Unchanged on exit.

    BETA   - REAL            .
             On entry, BETA specifies the scalar beta.
             Unchanged on exit.

    C      - REAL             array of DIMENSION ( LDC, n ).
             Before entry  with  UPLO = 'U' or 'u',  the leading  n by n
             upper triangular part of the array C must contain the upper
             triangular part  of the  symmetric matrix  and the strictly
             lower triangular part of C is not referenced.  On exit, the
             upper triangular part of the array  C is overwritten by the
             upper triangular part of the updated matrix.
             Before entry  with  UPLO = 'L' or 'l',  the leading  n by n
             lower triangular part of the array C must contain the lower
             triangular part  of the  symmetric matrix  and the strictly
             upper triangular part of C is not referenced.  On exit, the
             lower triangular part of the array  C is overwritten by the
             lower triangular part of the updated matrix.

    LDC    - INTEGER.
             On entry, LDC specifies the first dimension of C as declared
             in  the  calling  (sub)  program.   LDC  must  be  at  least
             max( 1, n ).
             Unchanged on exit.


    Level 3 Blas routine.

    -- Written on 8-February-1989.
       Jack Dongarra, Argonne National Laboratory.
       Iain Duff, AERE Harwell.
       Jeremy Du Croz, Numerical Algorithms Group Ltd.
       Sven Hammarling, Numerical Algorithms Group Ltd.


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    c_dim1 = *ldc;
    c_offset = 1 + c_dim1;
    c__ -= c_offset;

    /* Function Body */
    if (lsame_(trans, "N")) {
	nrowa = *n;
    } else {
	nrowa = *k;
    }
    upper = lsame_(uplo, "U");

    info = 0;
    if (! upper && ! lsame_(uplo, "L")) {
	info = 1;
    } else if (! lsame_(trans, "N") && ! lsame_(trans,
	    "T") && ! lsame_(trans, "C")) {
	info = 2;
    } else if (*n < 0) {
	info = 3;
    } else if (*k < 0) {
	info = 4;
    } else if (*lda < max(1,nrowa)) {
	info = 7;
    } else if (*ldc < max(1,*n)) {
	info = 10;
    }
    if (info != 0) {
	xerbla_("SSYRK ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*n == 0 || ((*alpha == 0.f || *k == 0) && *beta == 1.f)) {
	return 0;
    }

/*     And when  alpha.eq.zero. */

    if (*alpha == 0.f) {
	if (upper) {
	    if (*beta == 0.f) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L10: */
		    }
/* L20: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L30: */
		    }
/* L40: */
		}
	    }
	} else {
	    if (*beta == 0.f) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L50: */
		    }
/* L60: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L70: */
		    }
/* L80: */
		}
	    }
	}
	return 0;
    }

/*     Start the operations. */

    if (lsame_(trans, "N")) {

/*        Form  C := alpha*A*A' + beta*C. */

	if (upper) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		if (*beta == 0.f) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L90: */
		    }
		} else if (*beta != 1.f) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L100: */
		    }
		}
		i__2 = *k;
		for (l = 1; l <= i__2; ++l) {
		    if (a[j + l * a_dim1] != 0.f) {
			temp = *alpha * a[j + l * a_dim1];
			i__3 = j;
			for (i__ = 1; i__ <= i__3; ++i__) {
			    c__[i__ + j * c_dim1] += temp * a[i__ + l *
				    a_dim1];
/* L110: */
			}
		    }
/* L120: */
		}
/* L130: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		if (*beta == 0.f) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L140: */
		    }
		} else if (*beta != 1.f) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L150: */
		    }
		}
		i__2 = *k;
		for (l = 1; l <= i__2; ++l) {
		    if (a[j + l * a_dim1] != 0.f) {
			temp = *alpha * a[j + l * a_dim1];
			i__3 = *n;
			for (i__ = j; i__ <= i__3; ++i__) {
			    c__[i__ + j * c_dim1] += temp * a[i__ + l *
				    a_dim1];
/* L160: */
			}
		    }
/* L170: */
		}
/* L180: */
	    }
	}
    } else {

/*        Form  C := alpha*A'*A + beta*C. */

	if (upper) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = j;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    temp = 0.f;
		    i__3 = *k;
		    for (l = 1; l <= i__3; ++l) {
			temp += a[l + i__ * a_dim1] * a[l + j * a_dim1];
/* L190: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = *alpha * temp;
		    } else {
			c__[i__ + j * c_dim1] = *alpha * temp + *beta * c__[
				i__ + j * c_dim1];
		    }
/* L200: */
		}
/* L210: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *n;
		for (i__ = j; i__ <= i__2; ++i__) {
		    temp = 0.f;
		    i__3 = *k;
		    for (l = 1; l <= i__3; ++l) {
			temp += a[l + i__ * a_dim1] * a[l + j * a_dim1];
/* L220: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = *alpha * temp;
		    } else {
			c__[i__ + j * c_dim1] = *alpha * temp + *beta * c__[
				i__ + j * c_dim1];
		    }
/* L230: */
		}
/* L240: */
	    }
	}
    }

    return 0;

/*     End of SSYRK . */

}